

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O3

nng_err http_entity_alloc_data(nni_http_entity *entity,size_t size)

{
  char *pcVar1;
  
  if (size == 0) {
    if (entity->own == true) {
      nni_free(entity->data,entity->size);
    }
    size = 0;
  }
  else {
    pcVar1 = (char *)nni_zalloc(size);
    if (pcVar1 == (char *)0x0) {
      return NNG_ENOMEM;
    }
    if (entity->own == true) {
      nni_free(entity->data,entity->size);
    }
    entity->data = pcVar1;
  }
  entity->size = size;
  entity->own = true;
  return NNG_OK;
}

Assistant:

static nng_err
http_entity_alloc_data(nni_http_entity *entity, size_t size)
{
	void *newdata;
	if (size != 0) {
		if ((newdata = nni_zalloc(size)) == NULL) {
			return (NNG_ENOMEM);
		}
	}
	http_entity_set_data(entity, newdata, size);
	entity->own = true;
	return (NNG_OK);
}